

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O1

void SUNDlsMat_denseMatvec
               (sunrealtype **a,sunrealtype *x,sunrealtype *y,sunindextype m,sunindextype n)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  
  if (0 < m) {
    memset(y,0,m * 8);
  }
  if (0 < n) {
    lVar2 = 0;
    do {
      if (0 < m) {
        psVar1 = a[lVar2];
        lVar3 = 0;
        do {
          y[lVar3] = psVar1[lVar3] * x[lVar2] + y[lVar3];
          lVar3 = lVar3 + 1;
        } while (m != lVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != n);
  }
  return;
}

Assistant:

void SUNDlsMat_denseMatvec(sunrealtype** a, sunrealtype* x, sunrealtype* y,
                           sunindextype m, sunindextype n)
{
  sunindextype i, j;
  sunrealtype* col_j;

  for (i = 0; i < m; i++) { y[i] = ZERO; }

  for (j = 0; j < n; j++)
  {
    col_j = a[j];
    for (i = 0; i < m; i++) { y[i] += col_j[i] * x[j]; }
  }
}